

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

void xmlFreeParserCtxt(xmlParserCtxtPtr ctxt)

{
  _xmlSAXHandler *p_Var1;
  xmlNodePtr *ppxVar2;
  _xmlNode *p_Var3;
  _xmlAttr *p_Var4;
  char *pcVar5;
  xmlNodePtr pxVar6;
  xmlAttrPtr pxVar7;
  xmlParserInputPtr input;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    while (input = xmlCtxtPopInput(ctxt), input != (xmlParserInputPtr)0x0) {
      xmlFreeInputStream(input);
    }
    if (ctxt->spaceTab != (int *)0x0) {
      (*xmlFree)(ctxt->spaceTab);
    }
    if (ctxt->nameTab != (xmlChar **)0x0) {
      (*xmlFree)(ctxt->nameTab);
    }
    if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
      (*xmlFree)(ctxt->nodeTab);
    }
    if (ctxt->nodeInfoTab != (xmlParserNodeInfo *)0x0) {
      (*xmlFree)(ctxt->nodeInfoTab);
    }
    if (ctxt->inputTab != (xmlParserInputPtr *)0x0) {
      (*xmlFree)(ctxt->inputTab);
    }
    if (ctxt->version != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->version);
    }
    if (ctxt->encoding != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->encoding);
    }
    if (ctxt->extSubURI != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->extSubURI);
    }
    if (ctxt->extSubSystem != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->extSubSystem);
    }
    p_Var1 = ctxt->sax;
    if (p_Var1 != (_xmlSAXHandler *)&xmlDefaultSAXHandler && p_Var1 != (_xmlSAXHandler *)0x0) {
      (*xmlFree)(p_Var1);
    }
    if (ctxt->directory != (char *)0x0) {
      (*xmlFree)(ctxt->directory);
    }
    ppxVar2 = (ctxt->vctxt).nodeTab;
    if (ppxVar2 != (xmlNodePtr *)0x0) {
      (*xmlFree)(ppxVar2);
    }
    if (ctxt->atts != (xmlChar **)0x0) {
      (*xmlFree)(ctxt->atts);
    }
    if (ctxt->dict != (xmlDictPtr)0x0) {
      xmlDictFree(ctxt->dict);
    }
    if (ctxt->nsTab != (xmlChar **)0x0) {
      (*xmlFree)(ctxt->nsTab);
    }
    if (ctxt->nsdb != (xmlParserNsData *)0x0) {
      xmlParserNsFree(ctxt->nsdb);
    }
    if (ctxt->attrHash != (xmlAttrHashBucket *)0x0) {
      (*xmlFree)(ctxt->attrHash);
    }
    if (ctxt->pushTab != (xmlStartTag *)0x0) {
      (*xmlFree)(ctxt->pushTab);
    }
    if (ctxt->attallocs != (uint *)0x0) {
      (*xmlFree)(ctxt->attallocs);
    }
    if (ctxt->attsDefault != (xmlHashTablePtr)0x0) {
      xmlHashFree(ctxt->attsDefault,xmlHashDefaultDeallocator);
    }
    if (ctxt->attsSpecial != (xmlHashTablePtr)0x0) {
      xmlHashFree(ctxt->attsSpecial,(xmlHashDeallocator)0x0);
    }
    pxVar6 = ctxt->freeElems;
    while (pxVar6 != (xmlNodePtr)0x0) {
      p_Var3 = pxVar6->next;
      (*xmlFree)(pxVar6);
      pxVar6 = p_Var3;
    }
    pxVar7 = ctxt->freeAttrs;
    while (pxVar7 != (xmlAttrPtr)0x0) {
      p_Var4 = pxVar7->next;
      (*xmlFree)(pxVar7);
      pxVar7 = p_Var4;
    }
    pcVar5 = (ctxt->lastError).message;
    if (pcVar5 != (char *)0x0) {
      (*xmlFree)(pcVar5);
    }
    pcVar5 = (ctxt->lastError).file;
    if (pcVar5 != (char *)0x0) {
      (*xmlFree)(pcVar5);
    }
    pcVar5 = (ctxt->lastError).str1;
    if (pcVar5 != (char *)0x0) {
      (*xmlFree)(pcVar5);
    }
    pcVar5 = (ctxt->lastError).str2;
    if (pcVar5 != (char *)0x0) {
      (*xmlFree)(pcVar5);
    }
    pcVar5 = (ctxt->lastError).str3;
    if (pcVar5 != (char *)0x0) {
      (*xmlFree)(pcVar5);
    }
    if (ctxt->catalogs != (void *)0x0) {
      xmlCatalogFreeLocal(ctxt->catalogs);
    }
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlFreeParserCtxt(xmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr input;

    if (ctxt == NULL) return;

    while ((input = xmlCtxtPopInput(ctxt)) != NULL) { /* Non consuming */
        xmlFreeInputStream(input);
    }
    if (ctxt->spaceTab != NULL) xmlFree(ctxt->spaceTab);
    if (ctxt->nameTab != NULL) xmlFree((xmlChar * *)ctxt->nameTab);
    if (ctxt->nodeTab != NULL) xmlFree(ctxt->nodeTab);
    if (ctxt->nodeInfoTab != NULL) xmlFree(ctxt->nodeInfoTab);
    if (ctxt->inputTab != NULL) xmlFree(ctxt->inputTab);
    if (ctxt->version != NULL) xmlFree((char *) ctxt->version);
    if (ctxt->encoding != NULL) xmlFree((char *) ctxt->encoding);
    if (ctxt->extSubURI != NULL) xmlFree((char *) ctxt->extSubURI);
    if (ctxt->extSubSystem != NULL) xmlFree((char *) ctxt->extSubSystem);
#ifdef LIBXML_SAX1_ENABLED
    if ((ctxt->sax != NULL) &&
        (ctxt->sax != (xmlSAXHandlerPtr) &xmlDefaultSAXHandler))
#else
    if (ctxt->sax != NULL)
#endif /* LIBXML_SAX1_ENABLED */
        xmlFree(ctxt->sax);
    if (ctxt->directory != NULL) xmlFree(ctxt->directory);
    if (ctxt->vctxt.nodeTab != NULL) xmlFree(ctxt->vctxt.nodeTab);
    if (ctxt->atts != NULL) xmlFree((xmlChar * *)ctxt->atts);
    if (ctxt->dict != NULL) xmlDictFree(ctxt->dict);
    if (ctxt->nsTab != NULL) xmlFree(ctxt->nsTab);
    if (ctxt->nsdb != NULL) xmlParserNsFree(ctxt->nsdb);
    if (ctxt->attrHash != NULL) xmlFree(ctxt->attrHash);
    if (ctxt->pushTab != NULL) xmlFree(ctxt->pushTab);
    if (ctxt->attallocs != NULL) xmlFree(ctxt->attallocs);
    if (ctxt->attsDefault != NULL)
        xmlHashFree(ctxt->attsDefault, xmlHashDefaultDeallocator);
    if (ctxt->attsSpecial != NULL)
        xmlHashFree(ctxt->attsSpecial, NULL);
    if (ctxt->freeElems != NULL) {
        xmlNodePtr cur, next;

	cur = ctxt->freeElems;
	while (cur != NULL) {
	    next = cur->next;
	    xmlFree(cur);
	    cur = next;
	}
    }
    if (ctxt->freeAttrs != NULL) {
        xmlAttrPtr cur, next;

	cur = ctxt->freeAttrs;
	while (cur != NULL) {
	    next = cur->next;
	    xmlFree(cur);
	    cur = next;
	}
    }
    /*
     * cleanup the error strings
     */
    if (ctxt->lastError.message != NULL)
        xmlFree(ctxt->lastError.message);
    if (ctxt->lastError.file != NULL)
        xmlFree(ctxt->lastError.file);
    if (ctxt->lastError.str1 != NULL)
        xmlFree(ctxt->lastError.str1);
    if (ctxt->lastError.str2 != NULL)
        xmlFree(ctxt->lastError.str2);
    if (ctxt->lastError.str3 != NULL)
        xmlFree(ctxt->lastError.str3);

#ifdef LIBXML_CATALOG_ENABLED
    if (ctxt->catalogs != NULL)
	xmlCatalogFreeLocal(ctxt->catalogs);
#endif
    xmlFree(ctxt);
}